

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyIntegerMax
               (ResultCollector *result,QueriedState *state,int maxValue)

{
  ostream *poVar1;
  float fVar2;
  ostringstream buf;
  string local_1c0;
  float local_19c;
  ostringstream local_198 [376];
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if (-1 < maxValue) {
      return;
    }
    if ((state->m_v).vBool != false) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"Expected GL_TRUE, got GL_FALSE");
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_INTEGER:
    if ((state->m_v).vInt <= maxValue) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Expected less or equal to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,maxValue);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_INTEGER64:
    if ((state->m_v).vInt64 <= (long)maxValue) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Expected less or equal to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,maxValue);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_FLOAT:
    local_19c = (state->m_v).vFloat;
    fVar2 = deInt32ToFloatRoundToPosInf(maxValue);
    if ((local_19c <= fVar2) && (!NAN((state->m_v).vFloat))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Expected less or equal to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,maxValue);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::operator<<(poVar1,(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  default:
    goto switchD_014d5fb7_default;
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
switchD_014d5fb7_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}